

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::internal::
parse_format_string<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&>
          (internal *this,null_terminating_iterator<char> it,
          format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *handler)

{
  internal iVar1;
  internal iVar2;
  internal *handler_00;
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *this_00;
  internal *piVar3;
  char *pcVar4;
  internal *this_01;
  iterator begin;
  iterator begin_00;
  iterator it_00;
  iterator begin_01;
  iterator end;
  iterator end_00;
  iterator end_01;
  null_terminating_iterator<char> nVar5;
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *local_30;
  
  this_00 = (format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
             *)it.end_;
  piVar3 = (internal *)it.ptr_;
  this_01 = this;
  while( true ) {
    while( true ) {
      do {
        handler_00 = this_01;
        if ((handler_00 == piVar3) || (iVar1 = *handler_00, iVar1 == (internal)0x0)) {
          begin_01.end_ = (char *)piVar3;
          begin_01.ptr_ = (char *)this;
          end_01.end_ = (char *)piVar3;
          end_01.ptr_ = (char *)handler_00;
          format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          ::on_text(this_00,begin_01,end_01);
          return;
        }
        this_01 = handler_00 + 1;
      } while ((iVar1 != (internal)0x7d) && (iVar1 != (internal)0x7b));
      if (this_01 == piVar3) {
        iVar2 = (internal)0x0;
      }
      else {
        iVar2 = *this_01;
      }
      if (iVar2 != iVar1) break;
      begin.end_ = (char *)piVar3;
      begin.ptr_ = (char *)this;
      end.end_ = (char *)piVar3;
      end.ptr_ = (char *)this_01;
      format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
      ::on_text(this_00,begin,end);
      this = handler_00 + 2;
      this_01 = this;
    }
    if (iVar1 == (internal)0x7d) {
      pcVar4 = "unmatched \'}\' in format string";
      goto LAB_00113998;
    }
    begin_00.end_ = (char *)piVar3;
    begin_00.ptr_ = (char *)this;
    end_00.end_ = (char *)piVar3;
    end_00.ptr_ = (char *)handler_00;
    format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
    ::on_text(this_00,begin_00,end_00);
    nVar5.end_ = (char *)&local_30;
    nVar5.ptr_ = (char *)piVar3;
    local_30 = this_00;
    nVar5 = parse_arg_id<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&,char>>
                      (this_01,nVar5,
                       (id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
                        *)handler_00);
    it_00.end_ = nVar5.end_;
    pcVar4 = nVar5.ptr_;
    if (pcVar4 == it_00.end_) break;
    if (*pcVar4 == ':') {
      it_00.ptr_ = pcVar4 + 1;
      nVar5 = format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              ::on_format_specs(this_00,it_00);
      if ((nVar5.ptr_ == nVar5.end_) || (*nVar5.ptr_ != '}')) {
        pcVar4 = "unknown format specifier";
        goto LAB_00113998;
      }
    }
    else {
      if (*pcVar4 != '}') break;
      format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
      ::on_replacement_field(this_00,nVar5);
    }
    piVar3 = (internal *)nVar5.end_;
    this = (internal *)(nVar5.ptr_ + 1);
    this_01 = this;
  }
  pcVar4 = "missing \'}\' in format string";
LAB_00113998:
  error_handler::on_error((error_handler *)this_00,pcVar4);
  return;
}

Assistant:

FMT_CONSTEXPR void parse_format_string(Iterator it, Handler &&handler) {
  typedef typename std::iterator_traits<Iterator>::value_type char_type;
  auto start = it;
  while (*it) {
    char_type ch = *it++;
    if (ch != '{' && ch != '}') continue;
    if (*it == ch) {
      handler.on_text(start, it);
      start = ++it;
      continue;
    }
    if (ch == '}') {
      handler.on_error("unmatched '}' in format string");
      return;
    }
    handler.on_text(start, it - 1);

    it = parse_arg_id(it, id_adapter<Handler, char_type>(handler));
    if (*it == '}') {
      handler.on_replacement_field(it);
    } else if (*it == ':') {
      ++it;
      it = handler.on_format_specs(it);
      if (*it != '}') {
        handler.on_error("unknown format specifier");
        return;
      }
    } else {
      handler.on_error("missing '}' in format string");
      return;
    }

    start = ++it;
  }
  handler.on_text(start, it);
}